

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strs.c
# Opt level: O2

size_t nni_strnlen(char *s,size_t len)

{
  size_t sVar1;
  
  sVar1 = strnlen(s,len);
  return sVar1;
}

Assistant:

size_t
nni_strnlen(const char *s, size_t len)
{
#ifdef NNG_HAVE_STRNLEN
	return (strnlen(s, len));
#else
	size_t n;
	for (n = 0; (n < len) && (*s); n++) {
		s++;
	}
	return (n);
#endif
}